

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

void png_colorspace_set_rgb_coefficients(png_structrp png_ptr)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  char *error_message;
  double dVar8;
  
  if ((png_ptr->rgb_to_gray_coefficients_set != '\0') || (((png_ptr->colorspace).flags & 2) == 0)) {
    return;
  }
  uVar6 = (png_ptr->colorspace).end_points_XYZ.red_Y;
  if (-1 < (int)uVar6) {
    uVar4 = (png_ptr->colorspace).end_points_XYZ.green_Y;
    uVar5 = (png_ptr->colorspace).end_points_XYZ.blue_Y;
    iVar3 = uVar4 + uVar6 + uVar5;
    if (0 < iVar3) {
      dVar8 = (double)iVar3;
      if (uVar6 == 0) {
        bVar2 = true;
        uVar7 = 0;
      }
      else {
        dVar1 = floor(((double)(int)uVar6 * 32768.0) / dVar8 + 0.5);
        bVar2 = -2147483648.0 <= dVar1 && dVar1 <= 2147483647.0;
        uVar7 = (int)dVar1;
        if (-2147483648.0 > dVar1 || dVar1 > 2147483647.0) {
          uVar7 = uVar6;
        }
      }
      if (((-1 < (int)uVar4) && (bVar2)) && (uVar7 < 0x8001)) {
        if (uVar4 == 0) {
          bVar2 = true;
          uVar6 = 0;
        }
        else {
          dVar1 = floor(((double)(int)uVar4 * 32768.0) / dVar8 + 0.5);
          bVar2 = -2147483648.0 <= dVar1 && dVar1 <= 2147483647.0;
          uVar6 = (int)dVar1;
          if (-2147483648.0 > dVar1 || dVar1 > 2147483647.0) {
            uVar6 = uVar4;
          }
        }
        if (((-1 < (int)uVar5) && (bVar2)) && (uVar6 < 0x8001)) {
          if (uVar5 == 0) {
            bVar2 = true;
            uVar4 = 0;
          }
          else {
            dVar8 = floor(((double)(int)uVar5 * 32768.0) / dVar8 + 0.5);
            bVar2 = dVar8 <= 2147483647.0 && -2147483648.0 <= dVar8;
            uVar4 = (int)dVar8;
            if (dVar8 > 2147483647.0 || -2147483648.0 > dVar8) {
              uVar4 = uVar5;
            }
          }
          if (((bVar2) && (uVar4 < 0x8001)) && (iVar3 = uVar6 + uVar7 + uVar4, iVar3 < 0x8002)) {
            uVar5 = 0xffffffff;
            if (iVar3 != 0x8001) {
              uVar5 = (uint)(iVar3 < 0x8000);
            }
            if (iVar3 == 0x8001 || iVar3 < 0x8000) {
              if (((int)uVar6 < (int)uVar7) || ((int)uVar6 < (int)uVar4)) {
                if (((int)uVar7 < (int)uVar6) || ((int)uVar7 < (int)uVar4)) {
                  uVar4 = uVar4 + uVar5;
                }
                else {
                  uVar7 = uVar5 + uVar7;
                }
              }
              else {
                uVar6 = uVar5 + uVar6;
              }
            }
            if (uVar4 + uVar6 + uVar7 == 0x8000) {
              png_ptr->rgb_to_gray_red_coeff = (png_uint_16)uVar7;
              png_ptr->rgb_to_gray_green_coeff = (png_uint_16)uVar6;
              return;
            }
            error_message = "internal error handling cHRM coefficients";
            goto LAB_0010b33f;
          }
        }
      }
    }
  }
  error_message = "internal error handling cHRM->XYZ";
LAB_0010b33f:
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_colorspace_set_rgb_coefficients(png_structrp png_ptr)
{
   /* Set the rgb_to_gray coefficients from the colorspace. */
   if (png_ptr->rgb_to_gray_coefficients_set == 0 &&
      (png_ptr->colorspace.flags & PNG_COLORSPACE_HAVE_ENDPOINTS) != 0)
   {
      /* png_set_background has not been called, get the coefficients from the Y
       * values of the colorspace colorants.
       */
      png_fixed_point r = png_ptr->colorspace.end_points_XYZ.red_Y;
      png_fixed_point g = png_ptr->colorspace.end_points_XYZ.green_Y;
      png_fixed_point b = png_ptr->colorspace.end_points_XYZ.blue_Y;
      png_fixed_point total = r+g+b;

      if (total > 0 &&
         r >= 0 && png_muldiv(&r, r, 32768, total) && r >= 0 && r <= 32768 &&
         g >= 0 && png_muldiv(&g, g, 32768, total) && g >= 0 && g <= 32768 &&
         b >= 0 && png_muldiv(&b, b, 32768, total) && b >= 0 && b <= 32768 &&
         r+g+b <= 32769)
      {
         /* We allow 0 coefficients here.  r+g+b may be 32769 if two or
          * all of the coefficients were rounded up.  Handle this by
          * reducing the *largest* coefficient by 1; this matches the
          * approach used for the default coefficients in pngrtran.c
          */
         int add = 0;

         if (r+g+b > 32768)
            add = -1;
         else if (r+g+b < 32768)
            add = 1;

         if (add != 0)
         {
            if (g >= r && g >= b)
               g += add;
            else if (r >= g && r >= b)
               r += add;
            else
               b += add;
         }

         /* Check for an internal error. */
         if (r+g+b != 32768)
            png_error(png_ptr,
                "internal error handling cHRM coefficients");

         else
         {
            png_ptr->rgb_to_gray_red_coeff   = (png_uint_16)r;
            png_ptr->rgb_to_gray_green_coeff = (png_uint_16)g;
         }
      }

      /* This is a png_error at present even though it could be ignored -
       * it should never happen, but it is important that if it does, the
       * bug is fixed.
       */
      else
         png_error(png_ptr, "internal error handling cHRM->XYZ");
   }
}